

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_string_ptr(char *str,printbuffer *p)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  int iStack_3c;
  uchar token;
  int flag;
  int len;
  char *out;
  char *ptr2;
  char *ptr;
  printbuffer *p_local;
  char *str_local;
  
  iStack_3c = 0;
  bVar5 = false;
  ptr2 = str;
  if (str == (char *)0x0) {
    if (p == (printbuffer *)0x0) {
      _flag = (char *)(*cJSON_malloc)(3);
    }
    else {
      _flag = ensure(p,3);
    }
    if (_flag == (char *)0x0) {
      str_local = (char *)0x0;
    }
    else {
      strcpy(_flag,"\"\"");
      str_local = _flag;
    }
  }
  else {
    for (; *ptr2 != '\0'; ptr2 = ptr2 + 1) {
      if (((*ptr2 < '\x01') || (bVar4 = true, '\x1f' < *ptr2)) && (bVar4 = true, *ptr2 != '\"')) {
        bVar4 = *ptr2 == '\\';
      }
      bVar5 = (bool)(bVar4 | bVar5);
    }
    pcVar3 = str;
    if (bVar5) {
      while( true ) {
        ptr2 = pcVar3;
        bVar1 = *ptr2;
        bVar5 = false;
        if (bVar1 != 0) {
          iStack_3c = iStack_3c + 1;
          bVar5 = iStack_3c != 0;
        }
        if (!bVar5) break;
        pcVar3 = strchr("\"\\\b\f\n\r\t",(uint)bVar1);
        if (pcVar3 == (char *)0x0) {
          if (bVar1 < 0x20) {
            iStack_3c = iStack_3c + 5;
          }
        }
        else {
          iStack_3c = iStack_3c + 1;
        }
        pcVar3 = ptr2 + 1;
      }
      if (p == (printbuffer *)0x0) {
        _flag = (char *)(*cJSON_malloc)((long)(iStack_3c + 3));
      }
      else {
        _flag = ensure(p,iStack_3c + 3);
      }
      if (_flag == (char *)0x0) {
        str_local = (char *)0x0;
      }
      else {
        out = _flag + 1;
        *_flag = '\"';
        for (ptr2 = str; *ptr2 != '\0'; ptr2 = ptr2 + 1) {
          if ((((byte)*ptr2 < 0x20) || (*ptr2 == '\"')) || (*ptr2 == '\\')) {
            pcVar3 = out + 1;
            *out = '\\';
            bVar1 = *ptr2;
            if (bVar1 == 8) {
              out = out + 2;
              *pcVar3 = 'b';
            }
            else if (bVar1 == 9) {
              out = out + 2;
              *pcVar3 = 't';
            }
            else if (bVar1 == 10) {
              out = out + 2;
              *pcVar3 = 'n';
            }
            else if (bVar1 == 0xc) {
              out = out + 2;
              *pcVar3 = 'f';
            }
            else if (bVar1 == 0xd) {
              out = out + 2;
              *pcVar3 = 'r';
            }
            else if (bVar1 == 0x22) {
              out = out + 2;
              *pcVar3 = '\"';
            }
            else if (bVar1 == 0x5c) {
              out = out + 2;
              *pcVar3 = '\\';
            }
            else {
              sprintf(pcVar3,"u%04x",(ulong)bVar1);
              out = out + 6;
            }
          }
          else {
            *out = *ptr2;
            out = out + 1;
          }
        }
        *out = '\"';
        out[1] = '\0';
        str_local = _flag;
      }
    }
    else {
      iVar2 = (int)ptr2 - (int)str;
      if (p == (printbuffer *)0x0) {
        _flag = (char *)(*cJSON_malloc)((long)(iVar2 + 3));
      }
      else {
        _flag = ensure(p,iVar2 + 3);
      }
      if (_flag == (char *)0x0) {
        str_local = (char *)0x0;
      }
      else {
        pcVar3 = _flag + 1;
        *_flag = '\"';
        strcpy(pcVar3,str);
        pcVar3[iVar2] = '\"';
        pcVar3[iVar2 + 1] = '\0';
        str_local = _flag;
      }
    }
  }
  return str_local;
}

Assistant:

static char *print_string_ptr(const char *str,printbuffer *p)
{
	const char *ptr;char *ptr2,*out;int len=0,flag=0;unsigned char token;

	if (!str)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (!out) return 0;
		strcpy(out,"\"\"");
		return out;
	}
	
	for (ptr=str;*ptr;ptr++) flag|=((*ptr>0 && *ptr<32)||(*ptr=='\"')||(*ptr=='\\'))?1:0;
	if (!flag)
	{
		len=(int)(ptr-str);
		if (p) out=ensure(p,len+3);
		else		out=(char*)cJSON_malloc(len+3);
		if (!out) return 0;
		ptr2=out;*ptr2++='\"';
		strcpy(ptr2,str);
		ptr2[len]='\"';
		ptr2[len+1]=0;
		return out;
	}
	
	ptr=str;while ((token=*ptr) && ++len) {if (strchr("\"\\\b\f\n\r\t",token)) len++; else if (token<32) len+=5;ptr++;}
	
	if (p)	out=ensure(p,len+3);
	else	out=(char*)cJSON_malloc(len+3);
	if (!out) return 0;

	ptr2=out;ptr=str;
	*ptr2++='\"';
	while (*ptr)
	{
		if ((unsigned char)*ptr>31 && *ptr!='\"' && *ptr!='\\') *ptr2++=*ptr++;
		else
		{
			*ptr2++='\\';
			switch (token=*ptr++)
			{
				case '\\':	*ptr2++='\\';	break;
				case '\"':	*ptr2++='\"';	break;
				case '\b':	*ptr2++='b';	break;
				case '\f':	*ptr2++='f';	break;
				case '\n':	*ptr2++='n';	break;
				case '\r':	*ptr2++='r';	break;
				case '\t':	*ptr2++='t';	break;
				default: sprintf(ptr2,"u%04x",token);ptr2+=5;	break;	/* escape and print */
			}
		}
	}
	*ptr2++='\"';*ptr2++=0;
	return out;
}